

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

int __kmp_api_omp_get_place_num_(void)

{
  int gtid_00;
  kmp_info_t *pkVar1;
  kmp_info_t *thread;
  int gtid;
  int local_4;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  if (__kmp_affin_mask_size == 0) {
    local_4 = -1;
  }
  else {
    gtid_00 = __kmp_get_global_thread_id_reg();
    pkVar1 = __kmp_thread_from_gtid(gtid_00);
    if ((pkVar1->th).th_current_place < 0) {
      local_4 = -1;
    }
    else {
      local_4 = (pkVar1->th).th_current_place;
    }
  }
  return local_4;
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_PLACE_NUM)(void) {
#if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
  return -1;
#else
  int gtid;
  kmp_info_t *thread;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  if (!KMP_AFFINITY_CAPABLE())
    return -1;
  gtid = __kmp_entry_gtid();
  thread = __kmp_thread_from_gtid(gtid);
  if (thread->th.th_current_place < 0)
    return -1;
  return thread->th.th_current_place;
#endif
}